

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-try-write-error.c
# Opt level: O2

void connection_cb(uv_stream_t *server,int status)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_20;
  uv_buf_t buf;
  
  if (server == (uv_stream_t *)&tcp_server) {
    if (status == 0) {
      iVar1 = uv_tcp_init(tcp_server.loop,&tcp_peer);
      if (iVar1 == 0) {
        iVar1 = uv_accept(&tcp_server,&tcp_peer);
        if (iVar1 == 0) {
          iVar1 = uv_read_start(&tcp_peer,alloc_cb,read_cb);
          if (iVar1 == 0) {
            buf.base = "hello\n";
            buf.len = 6;
            iVar1 = uv_write(&write_req,&tcp_peer,&buf,1,write_cb);
            if (iVar1 == 0) {
              return;
            }
            pcVar2 = "r == 0";
            uStack_20 = 0x40;
          }
          else {
            pcVar2 = "r == 0";
            uStack_20 = 0x3a;
          }
        }
        else {
          pcVar2 = "r == 0";
          uStack_20 = 0x37;
        }
      }
      else {
        pcVar2 = "r == 0";
        uStack_20 = 0x34;
      }
    }
    else {
      pcVar2 = "status == 0";
      uStack_20 = 0x31;
    }
  }
  else {
    pcVar2 = "server == (uv_stream_t*)&tcp_server";
    uStack_20 = 0x30;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-to-half-open-connection.c"
          ,uStack_20,pcVar2);
  abort();
}

Assistant:

static void connection_cb(uv_stream_t* tcp, int status) {
  ASSERT(status == 0);

  ASSERT(0 == uv_tcp_init(tcp->loop, &incoming));
  ASSERT(0 == uv_accept(tcp, (uv_stream_t*) &incoming));

  connection_cb_called++;
  uv_close((uv_handle_t*) &incoming, incoming_close_cb);
  uv_close((uv_handle_t*) tcp, close_cb);
}